

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_pad_reflect_1d(ggml_context *ctx,ggml_tensor *a,int p0,int p1)

{
  ulong uVar1;
  _Bool _Var2;
  ggml_tensor *tensor;
  char *pcVar3;
  int line;
  int32_t params [2];
  
  if (p0 < 0) {
    pcVar3 = "p0 >= 0";
    line = 0x10c2;
  }
  else if (p1 < 0) {
    pcVar3 = "p1 >= 0";
    line = 0x10c3;
  }
  else {
    uVar1 = a->ne[0];
    if ((long)(ulong)(uint)p0 < (long)uVar1) {
      if ((uint)p1 < uVar1) {
        _Var2 = ggml_is_contiguous_0(a);
        if (_Var2) {
          if (a->type == GGML_TYPE_F32) {
            tensor = ggml_new_tensor_4d(ctx,GGML_TYPE_F32,(ulong)(uint)p1 + (ulong)(uint)p0 + uVar1,
                                        a->ne[1],a->ne[2],a->ne[3]);
            params[0] = p0;
            params[1] = p1;
            ggml_set_op_params(tensor,params,8);
            tensor->op = GGML_OP_PAD_REFLECT_1D;
            tensor->src[0] = a;
            return tensor;
          }
          pcVar3 = "a->type == GGML_TYPE_F32";
          line = 0x10c9;
        }
        else {
          pcVar3 = "ggml_is_contiguous(a)";
          line = 0x10c8;
        }
      }
      else {
        pcVar3 = "p1 < a->ne[0]";
        line = 0x10c6;
      }
    }
    else {
      pcVar3 = "p0 < a->ne[0]";
      line = 0x10c5;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

struct ggml_tensor * ggml_pad_reflect_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   p0,
        int                   p1) {
    GGML_ASSERT(p0 >= 0);
    GGML_ASSERT(p1 >= 0);

    GGML_ASSERT(p0 < a->ne[0]); // padding length on each size must be less than the
    GGML_ASSERT(p1 < a->ne[0]); // existing length of the dimension being padded

    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(a->type == GGML_TYPE_F32);

    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, a->type,
            a->ne[0] + p0 + p1,
            a->ne[1],
            a->ne[2],
            a->ne[3]);

    int32_t params[] = { p0, p1 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_PAD_REFLECT_1D;
    result->src[0] = a;

    return result;
}